

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Obj_t * Gia_ManFraigMarkCos(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  
  uVar2 = *(undefined8 *)pObj;
  if (((int)(uint)uVar2 < 0) && (((uint)uVar2 & 0x1fffffff) != 0x1fffffff)) {
    while (((int)(uint)uVar2 < 0 && (((uint)uVar2 & 0x1fffffff) != 0x1fffffff))) {
      if (fMark != 0) {
        Gia_ObjSetTravIdCurrent(p,pObj);
        Gia_ObjSetTravIdCurrent(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
      }
      pGVar1 = pObj + -1;
      pObj = pObj + -1;
      uVar2 = *(undefined8 *)pGVar1;
    }
    return pObj;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                ,0xed,"Gia_Obj_t *Gia_ManFraigMarkCos(Gia_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCos( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCo(pObj) ); Gia_ObjIsCo(pObj); pObj-- )
        if ( fMark )
        {
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
    return pObj;
}